

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArgumentsObject.cpp
# Opt level: O0

ES5HeapArgumentsObject * __thiscall
Js::HeapArgumentsObject::ConvertToUnmappedArgumentsObject
          (HeapArgumentsObject *this,bool overwriteArgsUsingFrameObject)

{
  ES5HeapArgumentsObject *this_00;
  bool bVar1;
  uint local_24;
  uint i;
  ES5HeapArgumentsObject *es5ArgsObj;
  bool overwriteArgsUsingFrameObject_local;
  HeapArgumentsObject *this_local;
  
  this_00 = ConvertToES5HeapArgumentsObject(this,overwriteArgsUsingFrameObject);
  local_24 = 0;
  while( true ) {
    bVar1 = false;
    if (local_24 < this->formalCount) {
      bVar1 = local_24 < (*(uint *)&this->field_0x20 & 0x7fffffff);
    }
    if (!bVar1) break;
    ES5HeapArgumentsObject::DisconnectFormalFromNamedArgument(this_00,local_24);
    local_24 = local_24 + 1;
  }
  return this_00;
}

Assistant:

ES5HeapArgumentsObject* HeapArgumentsObject::ConvertToUnmappedArgumentsObject(bool overwriteArgsUsingFrameObject)
    {
        ES5HeapArgumentsObject* es5ArgsObj = ConvertToES5HeapArgumentsObject(overwriteArgsUsingFrameObject);

        for (uint i=0; i<this->formalCount && i<numOfArguments; ++i)
        {
            es5ArgsObj->DisconnectFormalFromNamedArgument(i);
        }

        return es5ArgsObj;
    }